

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::RemoveLogSink(LogSink *destination)

{
  vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *this;
  __normal_iterator<google::LogSink_**,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
  __first;
  undefined1 local_10 [8];
  
  std::__shared_mutex_pthread::lock((__shared_mutex_pthread *)sink_mutex_);
  this = sinks_;
  if (sinks_ != (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<google::LogSink**,std::vector<google::LogSink*,std::allocator<google::LogSink*>>>,__gnu_cxx::__ops::_Iter_equals_val<google::LogSink*const>>
                        ((__normal_iterator<google::LogSink_**,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
                          )(sinks_->
                           super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<google::LogSink_**,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>
                          )(sinks_->
                           super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish,
                         (_Iter_equals_val<google::LogSink_*const>)local_10);
    std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::erase
              (this,(const_iterator)__first._M_current,
               (const_iterator)
               (sinks_->super__Vector_base<google::LogSink_*,_std::allocator<google::LogSink_*>_>).
               _M_impl.super__Vector_impl_data._M_finish);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)sink_mutex_);
  return;
}

Assistant:

inline void LogDestination::RemoveLogSink(LogSink* destination) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  SinkLock l{sink_mutex_};
  // This doesn't keep the sinks in order, but who cares?
  if (sinks_) {
    sinks_->erase(std::remove(sinks_->begin(), sinks_->end(), destination),
                  sinks_->end());
  }
}